

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserexternalvariable.cpp
# Opt level: O2

VariablePtr __thiscall libcellml::AnalyserExternalVariable::variable(AnalyserExternalVariable *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *in_RSI;
  VariablePtr VVar1;
  
  std::__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *)*in_RSI);
  VVar1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  VVar1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (VariablePtr)VVar1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VariablePtr AnalyserExternalVariable::variable() const
{
    return mPimpl->mVariable;
}